

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_crm.cc
# Opt level: O2

void __thiscall aliyun::Crm::~Crm(Crm *this)

{
  free(this->appid_);
  free(this->secret_);
  free(this->host_);
  free(this->region_id_);
  free(this->proxy_host_);
  return;
}

Assistant:

Crm::~Crm() {
    free(appid_);
    free(secret_);
    free(host_);
    if(region_id_) free(region_id_);
    if(proxy_host_) free(proxy_host_);
  }